

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O2

void __thiscall IrSim::buildActive(IrSim *this)

{
  uint uVar1;
  pointer piVar2;
  pointer pIVar3;
  ulong uVar4;
  int blk;
  int i;
  Operand *op;
  int i_00;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  uVar4 = ((long)(this->edges).
                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->edges).
                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  ::clear(&this->use);
  iVar5 = (int)uVar4;
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  ::resize(&this->use,(long)iVar5);
  uVar7 = 0;
  uVar4 = uVar4 & 0xffffffff;
  if (iVar5 < 1) {
    uVar4 = uVar7;
  }
  while (uVar8 = uVar7, uVar8 != uVar4) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::clear(&(this->lastUsages)._M_t);
    piVar2 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = piVar2[uVar8];
    i = piVar2[uVar8 + 1];
    lVar6 = (long)i * 0x98 + -0x30;
    lVar9 = (long)i;
    while( true ) {
      i = i + -1;
      uVar7 = uVar8 + 1;
      if (lVar9 <= iVar5) break;
      pIVar3 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
               super__Vector_impl_data._M_start;
      op = (Operand *)((long)pIVar3 + lVar6 + -0x60);
      uVar1 = *(uint *)((long)pIVar3 + lVar6 + -0x68);
      blk = (int)uVar8;
      if (uVar1 - 0x14 < 0xfffffff5) {
        if (uVar1 == 8) {
          setUsage(this,op,blk,i);
          i_00 = (int)(lVar9 + -1);
        }
        else {
          unsetUsage(this,op,blk);
          i_00 = i;
        }
        setUsage(this,(Operand *)
                      ((long)(this->irList).
                             super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar6 + -0x30),blk,i_00);
        setUsage(this,(Operand *)
                      ((long)&((this->irList).
                               super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                               super__Vector_impl_data._M_start)->kind + lVar6),blk,i_00);
      }
      else if ((uVar1 < 0x14) && ((0x81e00U >> (uVar1 & 0x1f) & 1) != 0)) {
        setUsage(this,op,blk,i);
      }
      lVar6 = lVar6 + -0x98;
      lVar9 = lVar9 + -1;
    }
  }
  return;
}

Assistant:

void IrSim::buildActive() {
    int size = (int)edges.size();
    use.clear();
//    lastUsages.clear();
    use.resize((size_t)size);
    for (int i = 0; i < size; ++i) {
        lastUsages.clear();
        for (int j = (int) basicBlocks[i], k = (int) basicBlocks[i + 1] - 1; k >= j; --k) {
            int kind = irList[k].kind;
            if (kind < IC_NONVAR || kind > IC_NONVAR_LAST) {
                if (kind != IC_DEREF_L)
                    unsetUsage(irList[k][0], i);
                else
                    setUsage(irList[k][0], i, k);
                setUsage(irList[k][1], i, k);
                setUsage(irList[k][2], i ,k);
            }
            else if (kind == IC_WRITE || kind == IC_ARG || kind == IC_ARGADDR || kind == IC_RETURN || kind == IC_CALL) {
                setUsage(irList[k][0], i, k);
            }
        }
    }
}